

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::AddPointEdge
          (CrossingProcessor *this,S2Point *p,int dimension)

{
  S2Builder *pSVar1;
  undefined1 in_AL;
  undefined7 in_register_00000001;
  undefined8 uStack_28;
  
  uStack_28 = CONCAT71(in_register_00000001,in_AL);
  pSVar1 = this->builder_;
  if (pSVar1 != (S2Builder *)0x0) {
    if (this->prev_inside_ == false) {
      SetClippingState(this,-1,true);
    }
    uStack_28 = CONCAT17((char)dimension,(undefined7)uStack_28);
    std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
              (this->input_dimensions_,(char *)((long)&uStack_28 + 7));
    S2Builder::AddEdge(this->builder_,p,p);
    this->prev_inside_ = true;
  }
  return pSVar1 != (S2Builder *)0x0;
}

Assistant:

bool AddPointEdge(const S2Point& p, int dimension) {
    if (builder_ == nullptr) return false;  // Boolean output.
    if (!prev_inside_) SetClippingState(kSetInside, true);
    input_dimensions_->push_back(dimension);
    builder_->AddEdge(p, p);
    prev_inside_ = true;
    return true;
  }